

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX.h
# Opt level: O2

void __thiscall
Am_Drawonable_Impl::Am_Drawonable_Impl
          (Am_Drawonable_Impl *this,int l,int t,uint w,uint h,char *tit,char *icon_tit,bool vis,
          bool initially_iconified,Am_Style back_color,bool save_under_flag,int min_w,int min_h,
          int max_w,int max_h,bool title_bar_flag,bool clip_by_children_flag,uint bit_depth,
          Am_Input_Event_Handlers *evh)

{
  size_t sVar1;
  char *pcVar2;
  uint uVar3;
  
  Am_Drawonable::Am_Drawonable(&this->super_Am_Drawonable);
  (this->super_Am_Drawonable)._vptr_Am_Drawonable = (_func_int **)&PTR_Create_002eb810;
  (this->super_Am_Drawonable).left = l;
  (this->super_Am_Drawonable).top = t;
  (this->super_Am_Drawonable).width = w + (w == 0);
  (this->super_Am_Drawonable).height = h + (h == 0);
  sVar1 = strlen(tit);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  (this->super_Am_Drawonable).title = pcVar2;
  strcpy(pcVar2,tit);
  sVar1 = strlen(icon_tit);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  (this->super_Am_Drawonable).icon_name = pcVar2;
  strcpy(pcVar2,icon_tit);
  (this->super_Am_Drawonable).visible = vis;
  (this->super_Am_Drawonable).iconified = initially_iconified;
  Am_Style::operator=(&(this->super_Am_Drawonable).background_color,(Am_Style *)back_color.data);
  (this->super_Am_Drawonable).border_width = (uint)title_bar_flag + (uint)title_bar_flag;
  (this->super_Am_Drawonable).save_under = save_under_flag;
  if (min_w < 2) {
    min_w = 1;
  }
  (this->super_Am_Drawonable).min_width = min_w;
  uVar3 = 1;
  if (1 < min_h) {
    uVar3 = min_h;
  }
  (this->super_Am_Drawonable).min_height = uVar3;
  (this->super_Am_Drawonable).max_width = max_w;
  (this->super_Am_Drawonable).max_height = max_h;
  (this->super_Am_Drawonable).title_bar = title_bar_flag;
  (this->super_Am_Drawonable).clip_by_children = clip_by_children_flag;
  (this->super_Am_Drawonable).depth = bit_depth;
  this->event_handlers = evh;
  this->offscreen = false;
  this->ext_handler = (Am_External_Event_Handler *)0x0;
  this->expect_map_change = false;
  return;
}

Assistant:

Am_Drawonable_Impl(int l, int t, unsigned int w, unsigned int h,
                     const char *tit, const char *icon_tit, bool vis,
                     bool initially_iconified, Am_Style back_color,
                     bool save_under_flag, int min_w, int min_h, int max_w,
                     int max_h, bool title_bar_flag, bool clip_by_children_flag,
                     unsigned int bit_depth, Am_Input_Event_Handlers *evh)

  {
    left = l;
    top = t;
    // avoid 0-sized windows
    width = ((w > 0) ? w : 1);
    height = ((h > 0) ? h : 1);
    title = new char[strlen(tit) + 1];
    strcpy(title, tit);
    icon_name = new char[strlen(icon_tit) + 1];
    strcpy(icon_name, icon_tit);
    visible = vis;
    iconified = initially_iconified;
    background_color = back_color;
    border_width = title_bar_flag ? 2 : 0;

    save_under = save_under_flag;

    // avoid 0-sized window
    min_width = ((min_w > 0) ? min_w : 1);
    min_height = ((min_h > 0) ? min_h : 1);

    max_width = max_w;
    max_height = max_h;
    title_bar = title_bar_flag;
    clip_by_children = clip_by_children_flag;
    depth = bit_depth;
    event_handlers = evh;
    // initialize title bar height member
    offscreen = false;
    ext_handler = nullptr;
    expect_map_change = false;
  }